

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall llvm::yaml::Document::Document(Document *this,Stream *S)

{
  _Rb_tree_header *p_Var1;
  SmallVectorImpl<void_*> *pSVar2;
  SmallVectorImpl<std::pair<void_*,_unsigned_long>_> *pSVar3;
  bool bVar4;
  mapped_type *pmVar5;
  Token *pTVar6;
  Token local_68;
  key_type local_30;
  
  this->stream = S;
  (this->NodeAllocator).CurPtr = (char *)0x0;
  (this->NodeAllocator).End = (char *)0x0;
  (this->NodeAllocator).Slabs.super_SmallVectorImpl<void_*>.
  super_SmallVectorTemplateBase<void_*,_true>.super_SmallVectorTemplateCommon<void_*,_void>.
  super_SmallVectorBase.BeginX = &(this->NodeAllocator).Slabs.super_SmallVectorStorage<void_*,_4U>;
  pSVar2 = &(this->NodeAllocator).Slabs.super_SmallVectorImpl<void_*>;
  (pSVar2->super_SmallVectorTemplateBase<void_*,_true>).
  super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Size = 0;
  (pSVar2->super_SmallVectorTemplateBase<void_*,_true>).
  super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.Capacity = 4;
  (this->NodeAllocator).CustomSizedSlabs.super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
  super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>.
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
  BeginX = &(this->NodeAllocator).BytesAllocated;
  pSVar3 = &(this->NodeAllocator).CustomSizedSlabs.
            super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>;
  (pSVar3->super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>).
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.Size
       = 0;
  (pSVar3->super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>).
  super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.super_SmallVectorBase.
  Capacity = 0;
  (this->NodeAllocator).BytesAllocated = 0;
  (this->NodeAllocator).RedZoneSize = 1;
  this->Root = (Node *)0x0;
  p_Var1 = &(this->TagMap)._M_t._M_impl.super__Rb_tree_header;
  (this->TagMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TagMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TagMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TagMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->TagMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_30.Data = "!";
  local_30.Length = 1;
  pmVar5 = std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::operator[](&this->TagMap,&local_30);
  pmVar5->Data = "!";
  pmVar5->Length = 1;
  local_30.Data = "!!";
  local_30.Length = 2;
  pmVar5 = std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::operator[](&this->TagMap,&local_30);
  pmVar5->Data = "tag:yaml.org,2002:";
  pmVar5->Length = 0x12;
  bVar4 = parseDirectives(this);
  if (bVar4) {
    expectToken(this,5);
  }
  pTVar6 = Scanner::peekNext((Scanner *)
                             (this->stream->scanner)._M_t.
                             super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                             .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
  if (pTVar6->Kind == TK_DocumentStart) {
    Scanner::getNext(&local_68,
                     (Scanner *)
                     (this->stream->scanner)._M_t.
                     super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                     .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.Value._M_dataplus._M_p != &local_68.Value.field_2) {
      operator_delete(local_68.Value._M_dataplus._M_p,
                      local_68.Value.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

Document::Document(Stream &S) : stream(S), Root(nullptr) {
  // Tag maps starts with two default mappings.
  TagMap["!"] = "!";
  TagMap["!!"] = "tag:yaml.org,2002:";

  if (parseDirectives())
    expectToken(Token::TK_DocumentStart);
  Token &T = peekNext();
  if (T.Kind == Token::TK_DocumentStart)
    getNext();
}